

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HyperLogLogTest.cpp
# Opt level: O3

bool __thiscall TrailingZeroes_test::DoTest(TrailingZeroes_test *this)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t fnv64;
  bool bVar6;
  
  uVar4 = 0;
  do {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      fnv64 = uVar4 * 0x101010101010101 + 0x101010101010101 << ((byte)uVar3 & 0x3f);
      uVar2 = HyperLogLog::TrailingZeroes(fnv64);
      uVar5 = (ulong)uVar2;
      if (uVar3 != uVar5) {
        TEST_LOG("NbZeroes(0x%lx) = %d instead of %d\n",fnv64,uVar5,uVar3 & 0xffffffff);
        goto LAB_0017e1c3;
      }
      uVar1 = uVar3 + 1;
    } while (uVar3 < 0x1f);
    bVar6 = uVar4 < 0xfe;
    uVar4 = uVar4 + 2;
  } while (bVar6);
LAB_0017e1c3:
  return uVar3 == uVar5;
}

Assistant:

bool TrailingZeroes_test::DoTest()
{
    bool ret = true;

    for (uint64_t i = 0; ret && i < 256; i += 2) {
        uint64_t t64;
        uint8_t mask = (uint8_t)((i + 1) & 0xff);
        memset(&t64, mask, sizeof(t64));
        t64 |= 1;
        for (int z = 0; ret && z < 32; z++) {
            uint64_t tz = (t64 << z);
            int zv = HyperLogLog::TrailingZeroes(tz);

            if (zv != z) {
                TEST_LOG("NbZeroes(0x%" PRIx64 ") = %d instead of %d\n",
                    tz, zv, z);
                ret = false;
            }
        }
    }
    return ret;
}